

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDMeshFragment * __thiscall ON_SubDMeshFragment::LastFaceFragment(ON_SubDMeshFragment *this)

{
  bool bVar1;
  ON_SubDMeshFragment *local_28;
  ON_SubDMeshFragment *first;
  ON_SubDMeshFragment *last;
  ON_SubDMeshFragment *this_local;
  
  bVar1 = IsFullFaceFragment(this);
  this_local = this;
  if (!bVar1) {
    bVar1 = IsFaceCornerFragment(this);
    first = this;
    if (bVar1) {
      while( true ) {
        bVar1 = false;
        if (first != (ON_SubDMeshFragment *)0x0) {
          bVar1 = first->m_face_fragment_index + 1 < (uint)this->m_face_fragment_count;
        }
        if (!bVar1) break;
        first = NextFaceFragment(first,false);
      }
      if (first == (ON_SubDMeshFragment *)0x0) {
        this_local = (ON_SubDMeshFragment *)0x0;
      }
      else {
        local_28 = PreviousFaceFragment(first,false);
        while( true ) {
          bVar1 = false;
          if (local_28 != (ON_SubDMeshFragment *)0x0) {
            bVar1 = local_28->m_face_fragment_index != 0;
          }
          if (!bVar1) break;
          local_28 = PreviousFaceFragment(local_28,false);
        }
        if (local_28 == (ON_SubDMeshFragment *)0x0) {
          this_local = (ON_SubDMeshFragment *)0x0;
        }
        else {
          this_local = first;
        }
      }
    }
    else {
      this_local = (ON_SubDMeshFragment *)0x0;
    }
  }
  return this_local;
}

Assistant:

const ON_SubDMeshFragment* ON_SubDMeshFragment::LastFaceFragment() const
{
  if (IsFullFaceFragment())
    return this;
  if (false == IsFaceCornerFragment())
    return nullptr;

  const ON_SubDMeshFragment* last = this;
  while (nullptr != last && last->m_face_fragment_index + 1 < m_face_fragment_count)
    last = last->NextFaceFragment(false);
  if (nullptr == last)
    return nullptr;
  const ON_SubDMeshFragment* first = last->PreviousFaceFragment(false);
  while (nullptr != first && first->m_face_fragment_index > 0)
    first = first->PreviousFaceFragment(false);
  if (nullptr == first)
    return nullptr;
  return last;
}